

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

void __thiscall
FCompileContext::CheckReturn(FCompileContext *this,PPrototype *proto,FScriptPosition *pos)

{
  uint uVar1;
  PPrototype *pPVar2;
  undefined8 in_RAX;
  long lVar3;
  
  if (proto == (PPrototype *)0x0) {
    __assert_fail("proto != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x7b,"void FCompileContext::CheckReturn(PPrototype *, FScriptPosition &)");
  }
  pPVar2 = this->ReturnProto;
  if (pPVar2 == (PPrototype *)0x0) {
    this->ReturnProto = proto;
  }
  else {
    if ((pPVar2->ReturnTypes).Count < (proto->ReturnTypes).Count) {
      this->ReturnProto = proto;
      proto = pPVar2;
    }
    uVar1 = (proto->ReturnTypes).Count;
    if (uVar1 == 0) {
      if ((this->ReturnProto->ReturnTypes).Count != 0) {
LAB_00665135:
        FScriptPosition::Message(pos,2,"All return expressions must deduce to the same type",in_RAX)
        ;
        return;
      }
    }
    else {
      lVar3 = 0;
      do {
        if ((this->ReturnProto->ReturnTypes).Array[lVar3] != (proto->ReturnTypes).Array[lVar3])
        goto LAB_00665135;
        lVar3 = lVar3 + 1;
      } while (uVar1 != (uint)lVar3);
    }
  }
  return;
}

Assistant:

void FCompileContext::CheckReturn(PPrototype *proto, FScriptPosition &pos)
{
	assert(proto != nullptr);
	bool fail = false;

	if (ReturnProto == nullptr)
	{
		ReturnProto = proto;
		return;
	}

	// A prototype that defines fewer return types can be compatible with
	// one that defines more if the shorter one matches the initial types
	// for the longer one.
	if (ReturnProto->ReturnTypes.Size() < proto->ReturnTypes.Size())
	{ // Make proto the shorter one to avoid code duplication below.
		swapvalues(proto, ReturnProto);
	}
	// If one prototype returns nothing, they both must.
	if (proto->ReturnTypes.Size() == 0)
	{
		if (ReturnProto->ReturnTypes.Size() != 0)
		{
			fail = true;
		}
	}
	else
	{
		for (unsigned i = 0; i < proto->ReturnTypes.Size(); i++)
		{
			if (ReturnProto->ReturnTypes[i] != proto->ReturnTypes[i])
			{ // Incompatible
				fail = true;
				break;
			}
		}
	}

	if (fail)
	{
		pos.Message(MSG_ERROR, "All return expressions must deduce to the same type");
	}
}